

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

DateTimePatternGenerator * __thiscall
icu_63::DateTimePatternGenerator::operator=
          (DateTimePatternGenerator *this,DateTimePatternGenerator *other)

{
  DateTimeMatcher *pDVar1;
  DistanceInfo *pDVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  PtnSkeleton *pPVar10;
  int32_t iVar11;
  DateTimeMatcher *pDVar12;
  int32_t i;
  long lVar13;
  UnicodeString *src;
  long lVar14;
  undefined1 *puVar15;
  undefined1 *puVar16;
  
  if (other != this) {
    this->internalErrorCode = other->internalErrorCode;
    Locale::operator=(&this->pLocale,&other->pLocale);
    this->fDefaultHourFormatChar = other->fDefaultHourFormatChar;
    FormatParser::operator=(this->fp,other->fp);
    pDVar12 = this->dtMatcher;
    pDVar1 = other->dtMatcher;
    uVar3 = *(undefined8 *)(pDVar1->skeleton).type;
    uVar4 = *(undefined8 *)((pDVar1->skeleton).type + 2);
    uVar5 = *(undefined8 *)((pDVar1->skeleton).type + 4);
    uVar6 = *(undefined8 *)((pDVar1->skeleton).type + 6);
    uVar7 = *(undefined8 *)((pDVar1->skeleton).type + 8);
    uVar8 = *(undefined8 *)((pDVar1->skeleton).type + 10);
    uVar9 = *(undefined8 *)((pDVar1->skeleton).type + 0xe);
    *(undefined8 *)((pDVar12->skeleton).type + 0xc) = *(undefined8 *)((pDVar1->skeleton).type + 0xc)
    ;
    *(undefined8 *)((pDVar12->skeleton).type + 0xe) = uVar9;
    *(undefined8 *)((pDVar12->skeleton).type + 8) = uVar7;
    *(undefined8 *)((pDVar12->skeleton).type + 10) = uVar8;
    *(undefined8 *)((pDVar12->skeleton).type + 4) = uVar5;
    *(undefined8 *)((pDVar12->skeleton).type + 6) = uVar6;
    *(undefined8 *)(pDVar12->skeleton).type = uVar3;
    *(undefined8 *)((pDVar12->skeleton).type + 2) = uVar4;
    uVar3 = *(undefined8 *)((pDVar1->skeleton).original.chars + 8);
    *(undefined8 *)(pDVar12->skeleton).original.chars =
         *(undefined8 *)(pDVar1->skeleton).original.chars;
    *(undefined8 *)((pDVar12->skeleton).original.chars + 8) = uVar3;
    uVar3 = *(undefined8 *)((pDVar1->skeleton).original.lengths + 8);
    *(undefined8 *)(pDVar12->skeleton).original.lengths =
         *(undefined8 *)(pDVar1->skeleton).original.lengths;
    *(undefined8 *)((pDVar12->skeleton).original.lengths + 8) = uVar3;
    uVar3 = *(undefined8 *)((pDVar1->skeleton).baseOriginal.chars + 8);
    *(undefined8 *)(pDVar12->skeleton).baseOriginal.chars =
         *(undefined8 *)(pDVar1->skeleton).baseOriginal.chars;
    *(undefined8 *)((pDVar12->skeleton).baseOriginal.chars + 8) = uVar3;
    uVar3 = *(undefined8 *)((pDVar1->skeleton).baseOriginal.lengths + 8);
    *(undefined8 *)(pDVar12->skeleton).baseOriginal.lengths =
         *(undefined8 *)(pDVar1->skeleton).baseOriginal.lengths;
    *(undefined8 *)((pDVar12->skeleton).baseOriginal.lengths + 8) = uVar3;
    pDVar2 = this->distanceInfo;
    iVar11 = other->distanceInfo->extraFieldMask;
    pDVar2->missingFieldMask = other->distanceInfo->missingFieldMask;
    pDVar2->extraFieldMask = iVar11;
    icu_63::UnicodeString::operator=(&this->dateTimeFormat,&other->dateTimeFormat);
    src = &other->decimal;
    icu_63::UnicodeString::operator=(&this->decimal,src);
    icu_63::UnicodeString::getTerminatedBuffer(&this->dateTimeFormat);
    icu_63::UnicodeString::getTerminatedBuffer(&this->decimal);
    if (this->skipMatcher != (DateTimeMatcher *)0x0) {
      (*this->skipMatcher->_vptr_DateTimeMatcher[1])();
    }
    if (other->skipMatcher == (DateTimeMatcher *)0x0) {
      pDVar12 = (DateTimeMatcher *)0x0;
    }
    else {
      pDVar12 = (DateTimeMatcher *)UMemory::operator_new((UMemory *)0x98,(size_t)src);
      if (pDVar12 == (DateTimeMatcher *)0x0) {
        this->skipMatcher = (DateTimeMatcher *)0x0;
        this->internalErrorCode = U_MEMORY_ALLOCATION_ERROR;
        return this;
      }
      pDVar1 = other->skipMatcher;
      pDVar12->_vptr_DateTimeMatcher = (_func_int **)&PTR__DateTimeMatcher_00463840;
      (pDVar12->skeleton)._vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_004638a8;
      (pDVar12->skeleton).original.chars[0] = '\0';
      (pDVar12->skeleton).original.chars[1] = '\0';
      (pDVar12->skeleton).original.chars[2] = '\0';
      (pDVar12->skeleton).original.chars[3] = '\0';
      (pDVar12->skeleton).original.chars[4] = '\0';
      (pDVar12->skeleton).original.chars[5] = '\0';
      (pDVar12->skeleton).original.chars[6] = '\0';
      (pDVar12->skeleton).original.chars[7] = '\0';
      pPVar10 = &pDVar12->skeleton;
      (pPVar10->original).chars[8] = '\0';
      (pPVar10->original).chars[9] = '\0';
      (pPVar10->original).chars[10] = '\0';
      (pPVar10->original).chars[0xb] = '\0';
      (pPVar10->original).chars[0xc] = '\0';
      (pPVar10->original).chars[0xd] = '\0';
      (pPVar10->original).chars[0xe] = '\0';
      (pPVar10->original).chars[0xf] = '\0';
      (pDVar12->skeleton).original.lengths[0] = '\0';
      (pDVar12->skeleton).original.lengths[1] = '\0';
      (pDVar12->skeleton).original.lengths[2] = '\0';
      (pDVar12->skeleton).original.lengths[3] = '\0';
      (pDVar12->skeleton).original.lengths[4] = '\0';
      (pDVar12->skeleton).original.lengths[5] = '\0';
      (pDVar12->skeleton).original.lengths[6] = '\0';
      (pDVar12->skeleton).original.lengths[7] = '\0';
      pPVar10 = &pDVar12->skeleton;
      (pPVar10->original).lengths[8] = '\0';
      (pPVar10->original).lengths[9] = '\0';
      (pPVar10->original).lengths[10] = '\0';
      (pPVar10->original).lengths[0xb] = '\0';
      (pPVar10->original).lengths[0xc] = '\0';
      (pPVar10->original).lengths[0xd] = '\0';
      (pPVar10->original).lengths[0xe] = '\0';
      (pPVar10->original).lengths[0xf] = '\0';
      (pDVar12->skeleton).baseOriginal.chars[0] = '\0';
      (pDVar12->skeleton).baseOriginal.chars[1] = '\0';
      (pDVar12->skeleton).baseOriginal.chars[2] = '\0';
      (pDVar12->skeleton).baseOriginal.chars[3] = '\0';
      (pDVar12->skeleton).baseOriginal.chars[4] = '\0';
      (pDVar12->skeleton).baseOriginal.chars[5] = '\0';
      (pDVar12->skeleton).baseOriginal.chars[6] = '\0';
      (pDVar12->skeleton).baseOriginal.chars[7] = '\0';
      pPVar10 = &pDVar12->skeleton;
      (pPVar10->baseOriginal).chars[8] = '\0';
      (pPVar10->baseOriginal).chars[9] = '\0';
      (pPVar10->baseOriginal).chars[10] = '\0';
      (pPVar10->baseOriginal).chars[0xb] = '\0';
      (pPVar10->baseOriginal).chars[0xc] = '\0';
      (pPVar10->baseOriginal).chars[0xd] = '\0';
      (pPVar10->baseOriginal).chars[0xe] = '\0';
      (pPVar10->baseOriginal).chars[0xf] = '\0';
      (pDVar12->skeleton).baseOriginal.lengths[0] = '\0';
      (pDVar12->skeleton).baseOriginal.lengths[1] = '\0';
      (pDVar12->skeleton).baseOriginal.lengths[2] = '\0';
      (pDVar12->skeleton).baseOriginal.lengths[3] = '\0';
      (pDVar12->skeleton).baseOriginal.lengths[4] = '\0';
      (pDVar12->skeleton).baseOriginal.lengths[5] = '\0';
      (pDVar12->skeleton).baseOriginal.lengths[6] = '\0';
      (pDVar12->skeleton).baseOriginal.lengths[7] = '\0';
      pPVar10 = &pDVar12->skeleton;
      (pPVar10->baseOriginal).lengths[8] = '\0';
      (pPVar10->baseOriginal).lengths[9] = '\0';
      (pPVar10->baseOriginal).lengths[10] = '\0';
      (pPVar10->baseOriginal).lengths[0xb] = '\0';
      (pPVar10->baseOriginal).lengths[0xc] = '\0';
      (pPVar10->baseOriginal).lengths[0xd] = '\0';
      (pPVar10->baseOriginal).lengths[0xe] = '\0';
      (pPVar10->baseOriginal).lengths[0xf] = '\0';
      uVar3 = *(undefined8 *)(pDVar1->skeleton).type;
      uVar4 = *(undefined8 *)((pDVar1->skeleton).type + 2);
      uVar5 = *(undefined8 *)((pDVar1->skeleton).type + 4);
      uVar6 = *(undefined8 *)((pDVar1->skeleton).type + 6);
      uVar7 = *(undefined8 *)((pDVar1->skeleton).type + 8);
      uVar8 = *(undefined8 *)((pDVar1->skeleton).type + 10);
      uVar9 = *(undefined8 *)((pDVar1->skeleton).type + 0xe);
      *(undefined8 *)((pDVar12->skeleton).type + 0xc) =
           *(undefined8 *)((pDVar1->skeleton).type + 0xc);
      *(undefined8 *)((pDVar12->skeleton).type + 0xe) = uVar9;
      *(undefined8 *)((pDVar12->skeleton).type + 8) = uVar7;
      *(undefined8 *)((pDVar12->skeleton).type + 10) = uVar8;
      *(undefined8 *)((pDVar12->skeleton).type + 4) = uVar5;
      *(undefined8 *)((pDVar12->skeleton).type + 6) = uVar6;
      *(undefined8 *)(pDVar12->skeleton).type = uVar3;
      *(undefined8 *)((pDVar12->skeleton).type + 2) = uVar4;
      uVar3 = *(undefined8 *)((pDVar1->skeleton).original.chars + 8);
      *(undefined8 *)(pDVar12->skeleton).original.chars =
           *(undefined8 *)(pDVar1->skeleton).original.chars;
      *(undefined8 *)((pDVar12->skeleton).original.chars + 8) = uVar3;
      uVar3 = *(undefined8 *)((pDVar1->skeleton).original.lengths + 8);
      *(undefined8 *)(pDVar12->skeleton).original.lengths =
           *(undefined8 *)(pDVar1->skeleton).original.lengths;
      *(undefined8 *)((pDVar12->skeleton).original.lengths + 8) = uVar3;
      uVar3 = *(undefined8 *)((pDVar1->skeleton).baseOriginal.chars + 8);
      *(undefined8 *)(pDVar12->skeleton).baseOriginal.chars =
           *(undefined8 *)(pDVar1->skeleton).baseOriginal.chars;
      *(undefined8 *)((pDVar12->skeleton).baseOriginal.chars + 8) = uVar3;
      uVar3 = *(undefined8 *)((pDVar1->skeleton).baseOriginal.lengths + 8);
      *(undefined8 *)(pDVar12->skeleton).baseOriginal.lengths =
           *(undefined8 *)(pDVar1->skeleton).baseOriginal.lengths;
      *(undefined8 *)((pDVar12->skeleton).baseOriginal.lengths + 8) = uVar3;
    }
    this->skipMatcher = pDVar12;
    puVar15 = &other->field_0x508;
    puVar16 = &this->field_0x508;
    for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
      icu_63::UnicodeString::operator=
                ((UnicodeString *)(&this->field_0x108 + lVar13 * 0x40),
                 (UnicodeString *)(&other->field_0x108 + lVar13 * 0x40));
      icu_63::UnicodeString::getTerminatedBuffer
                ((UnicodeString *)(&this->field_0x108 + lVar13 * 0x40));
      for (lVar14 = 0; lVar14 != 0xc0; lVar14 = lVar14 + 0x40) {
        icu_63::UnicodeString::operator=
                  ((UnicodeString *)(puVar16 + lVar14),(UnicodeString *)(puVar15 + lVar14));
        icu_63::UnicodeString::getTerminatedBuffer((UnicodeString *)(puVar16 + lVar14));
      }
      puVar15 = puVar15 + 0xc0;
      puVar16 = puVar16 + 0xc0;
    }
    PatternMap::copyFrom(this->patternMap,other->patternMap,&this->internalErrorCode);
    copyHashtable(this,other->fAvailableFormatKeyHash,&this->internalErrorCode);
  }
  return this;
}

Assistant:

DateTimePatternGenerator&
DateTimePatternGenerator::operator=(const DateTimePatternGenerator& other) {
    // reflexive case
    if (&other == this) {
        return *this;
    }
    internalErrorCode = other.internalErrorCode;
    pLocale = other.pLocale;
    fDefaultHourFormatChar = other.fDefaultHourFormatChar;
    *fp = *(other.fp);
    dtMatcher->copyFrom(other.dtMatcher->skeleton);
    *distanceInfo = *(other.distanceInfo);
    dateTimeFormat = other.dateTimeFormat;
    decimal = other.decimal;
    // NUL-terminate for the C API.
    dateTimeFormat.getTerminatedBuffer();
    decimal.getTerminatedBuffer();
    delete skipMatcher;
    if ( other.skipMatcher == nullptr ) {
        skipMatcher = nullptr;
    }
    else {
        skipMatcher = new DateTimeMatcher(*other.skipMatcher);
        if (skipMatcher == nullptr)
        {
            internalErrorCode = U_MEMORY_ALLOCATION_ERROR;
            return *this;
        }
    }
    for (int32_t i=0; i< UDATPG_FIELD_COUNT; ++i ) {
        appendItemFormats[i] = other.appendItemFormats[i];
        appendItemFormats[i].getTerminatedBuffer(); // NUL-terminate for the C API.
        for (int32_t j=0; j< UDATPG_WIDTH_COUNT; ++j ) {
            fieldDisplayNames[i][j] = other.fieldDisplayNames[i][j];
            fieldDisplayNames[i][j].getTerminatedBuffer(); // NUL-terminate for the C API.
        }
    }
    patternMap->copyFrom(*other.patternMap, internalErrorCode);
    copyHashtable(other.fAvailableFormatKeyHash, internalErrorCode);
    return *this;
}